

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

void __thiscall sjtu::TrainManager::bitset_set(TrainManager *this,uint x,uint y,uint bit)

{
  uint uVar1;
  long lVar2;
  uint local_23c;
  fstream bitset;
  char local_228 [512];
  
  std::fstream::fstream(&bitset,"Bitset.dat",_S_out|_S_in|_S_bin);
  lVar2 = (ulong)((y >> 5) + x * 0x200) << 2;
  std::istream::seekg(&bitset,lVar2,0);
  std::istream::read((char *)&bitset,(long)&local_23c);
  uVar1 = 1 << ((byte)y & 0x1f);
  if (bit == 0) {
    local_23c = ~uVar1 & local_23c;
  }
  else {
    local_23c = uVar1 | local_23c;
  }
  std::ostream::seekp(local_228,lVar2,0);
  std::ostream::write(local_228,(long)&local_23c);
  std::fstream::close();
  std::fstream::~fstream(&bitset);
  return;
}

Assistant:

void bitset_set(unsigned int x , unsigned int y , unsigned int bit = 1)
		{
			std::fstream bitset("Bitset.dat" , std::ios_base::in | std::ios_base::out | std::ios_base::binary);
			unsigned int bits;
			bitset.seekg((x * WS + y / W) * sizeof (int)) , bitset.read(reinterpret_cast<char *> (&bits) , sizeof (unsigned int));
			if (bit) bits |= 1 << y % W;
			else bits &= (~ 0) ^ (1 << y % W);
			bitset.seekp((x * WS + y / W) * sizeof (int)) , bitset.write(reinterpret_cast<char *> (&bits) , sizeof (unsigned int));
			bitset.close();
		}